

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O2

TestCaseGroup *
vkt::SpirVAssembly::anon_unknown_5::createOpSRemComputeGroup
          (TestContext *testCtx,qpTestResult negFailResult)

{
  deUint32 seed;
  TestCaseGroup *pTVar1;
  char *pcVar2;
  Buffer<int> *pBVar3;
  SpvAsmComputeShaderCase *this;
  int ndx;
  int numValues;
  long lVar4;
  _func_bool_long *in_R9;
  long lVar5;
  int in_stack_fffffffffffffd98;
  allocator<char> local_262;
  allocator<char> local_261;
  TestContext *local_260;
  long local_258;
  vector<int,_std::allocator<int>_> inputInts2;
  vector<int,_std::allocator<int>_> inputInts1;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  vector<int,_std::allocator<int>_> outputInts;
  Random rnd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  char *local_188 [2];
  qpTestResult local_178 [6];
  char *local_160;
  char *local_158;
  qpTestResult local_150;
  undefined8 local_14c;
  undefined8 uStack_144;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [88];
  vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
  local_a0 [24];
  int local_88 [10];
  qpTestResult local_60;
  char local_58 [40];
  
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  local_260 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,"opsrem","Test the OpSRem instruction");
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       pTVar1;
  seed = deStringHash((pTVar1->super_TestNode).m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,seed);
  local_188[0] = "positive";
  local_188[1] = "Output doesn\'t match with expected";
  local_178[0] = QP_TEST_RESULT_FAIL;
  local_178[1] = QP_TEST_RESULT_PASS;
  local_178[2] = 0x10000;
  local_178[3] = QP_TEST_RESULT_PASS;
  local_178[4] = 100;
  local_160 = "all";
  local_158 = "Inconsistent results, but within specification";
  local_14c = 0x10000ffff0000;
  uStack_144 = 0x64ffffff9c;
  lVar5 = 0;
  local_150 = negFailResult;
  while (pTVar1 = group.
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                  m_data.ptr, lVar5 != 2) {
    ComputeShaderSpec::ComputeShaderSpec((ComputeShaderSpec *)local_f8);
    local_210._M_dataplus._M_p._0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::vector
              (&inputInts1,200,(value_type_conflict1 *)&local_210,(allocator_type *)&local_1a8);
    local_210._M_dataplus._M_p._0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::vector
              (&inputInts2,200,(value_type_conflict1 *)&local_210,(allocator_type *)&local_1a8);
    local_210._M_dataplus._M_p._0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::vector
              (&outputInts,200,(value_type_conflict1 *)&local_210,(allocator_type *)&local_1a8);
    numValues = 200;
    local_258 = lVar5;
    fillRandomScalars<int>
              (&rnd,local_178[lVar5 * 10 + 1],local_178[lVar5 * 10 + 2],
               inputInts1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,200,(int)in_R9);
    SpirVAssembly::(anonymous_namespace)::fillRandomScalars<int,bool(*)(long)>
              (&rnd,local_178[lVar5 * 10 + 3],local_178[lVar5 * 10 + 4],
               inputInts2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,numValues,in_R9,in_stack_fffffffffffffd98);
    for (lVar4 = 0; lVar4 != 200; lVar4 = lVar4 + 1) {
      outputInts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar4] =
           inputInts1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar4] %
           inputInts2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar4];
    }
    pcVar2 = getComputeAsmShaderPreamble();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,pcVar2,&local_261);
    std::operator+(&local_1c8,&local_118,
                   "OpName %main           \"main\"\nOpName %id             \"gl_GlobalInvocationID\"\nOpDecorate %id BuiltIn GlobalInvocationId\nOpDecorate %buf BufferBlock\nOpDecorate %indata1 DescriptorSet 0\nOpDecorate %indata1 Binding 0\nOpDecorate %indata2 DescriptorSet 0\nOpDecorate %indata2 Binding 1\nOpDecorate %outdata DescriptorSet 0\nOpDecorate %outdata Binding 2\nOpDecorate %i32arr ArrayStride 4\nOpMemberDecorate %buf 0 Offset 0\n"
                  );
    pcVar2 = getComputeAsmCommonTypes();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,pcVar2,&local_262);
    std::operator+(&local_1a8,&local_1c8,&local_138);
    std::operator+(&local_210,&local_1a8,
                   "%buf        = OpTypeStruct %i32arr\n%bufptr     = OpTypePointer Uniform %buf\n%indata1    = OpVariable %bufptr Uniform\n%indata2    = OpVariable %bufptr Uniform\n%outdata    = OpVariable %bufptr Uniform\n%id        = OpVariable %uvec3ptr Input\n%zero      = OpConstant %i32 0\n%main      = OpFunction %void None %voidf\n%label     = OpLabel\n%idval     = OpLoad %uvec3 %id\n%x         = OpCompositeExtract %u32 %idval 0\n%inloc1    = OpAccessChain %i32ptr %indata1 %zero %x\n%inval1    = OpLoad %i32 %inloc1\n%inloc2    = OpAccessChain %i32ptr %indata2 %zero %x\n%inval2    = OpLoad %i32 %inloc2\n%rem       = OpSRem %i32 %inval1 %inval2\n%outloc    = OpAccessChain %i32ptr %outdata %zero %x\n             OpStore %outloc %rem\n             OpReturn\n             OpFunctionEnd\n"
                  );
    std::__cxx11::string::operator=((string *)local_f8,(string *)&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_118);
    pBVar3 = (Buffer<int> *)operator_new(0x20);
    Buffer<int>::Buffer(pBVar3,&inputInts1);
    de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
              ((SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_210,
               (BufferInterface *)pBVar3);
    std::
    vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
    ::emplace_back<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>
              ((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
                *)(local_f8 + 0x40),(SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_210);
    de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::~SharedPtr
              ((SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_210);
    pBVar3 = (Buffer<int> *)operator_new(0x20);
    Buffer<int>::Buffer(pBVar3,&inputInts2);
    de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
              ((SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_210,
               (BufferInterface *)pBVar3);
    std::
    vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
    ::emplace_back<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>
              ((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
                *)(local_f8 + 0x40),(SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_210);
    de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::~SharedPtr
              ((SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_210);
    pBVar3 = (Buffer<int> *)operator_new(0x20);
    Buffer<int>::Buffer(pBVar3,&outputInts);
    de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
              ((SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_210,
               (BufferInterface *)pBVar3);
    std::
    vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
    ::emplace_back<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>
              (local_a0,(SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_210);
    de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::~SharedPtr
              ((SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_210);
    local_88[0] = 200;
    local_88[1] = 1;
    local_88[2] = 1;
    local_60 = local_178[lVar5 * 10];
    std::__cxx11::string::assign(local_58);
    pTVar1 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
             m_data.ptr;
    this = (SpvAsmComputeShaderCase *)operator_new(0x140);
    in_R9 = (_func_bool_long *)0x0;
    SpvAsmComputeShaderCase::SpvAsmComputeShaderCase
              (this,local_260,local_188[lVar5 * 5],"",(ComputeShaderSpec *)local_f8,
               COMPUTE_TEST_USES_NONE);
    tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)this);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&outputInts.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&inputInts2.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&inputInts1.super__Vector_base<int,_std::allocator<int>_>);
    ComputeShaderSpec::~ComputeShaderSpec((ComputeShaderSpec *)local_f8);
    lVar5 = local_258 + 1;
  }
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createOpSRemComputeGroup (tcu::TestContext& testCtx, qpTestResult negFailResult)
{
	de::MovePtr<tcu::TestCaseGroup>	group			(new tcu::TestCaseGroup(testCtx, "opsrem", "Test the OpSRem instruction"));
	de::Random						rnd				(deStringHash(group->getName()));
	const int						numElements		= 200;

	const struct CaseParams
	{
		const char*		name;
		const char*		failMessage;		// customized status message
		qpTestResult	failResult;			// override status on failure
		int				op1Min, op1Max;		// operand ranges
		int				op2Min, op2Max;
	} cases[] =
	{
		{ "positive",	"Output doesn't match with expected",				QP_TEST_RESULT_FAIL,	0,		65536,	0,		100 },
		{ "all",		"Inconsistent results, but within specification",	negFailResult,			-65536,	65536,	-100,	100 },	// see below
	};
	// If either operand is negative the result is undefined. Some implementations may still return correct values.

	for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); ++caseNdx)
	{
		const CaseParams&	params		= cases[caseNdx];
		ComputeShaderSpec	spec;
		vector<deInt32>		inputInts1	(numElements, 0);
		vector<deInt32>		inputInts2	(numElements, 0);
		vector<deInt32>		outputInts	(numElements, 0);

		fillRandomScalars(rnd, params.op1Min, params.op1Max, &inputInts1[0], numElements);
		fillRandomScalars(rnd, params.op2Min, params.op2Max, &inputInts2[0], numElements, filterNotZero);

		for (int ndx = 0; ndx < numElements; ++ndx)
		{
			// The return value of std::fmod() has the same sign as its first operand, which is how OpFRem spec'd.
			outputInts[ndx] = inputInts1[ndx] % inputInts2[ndx];
		}

		spec.assembly =
			string(getComputeAsmShaderPreamble()) +

			"OpName %main           \"main\"\n"
			"OpName %id             \"gl_GlobalInvocationID\"\n"

			"OpDecorate %id BuiltIn GlobalInvocationId\n"

			"OpDecorate %buf BufferBlock\n"
			"OpDecorate %indata1 DescriptorSet 0\n"
			"OpDecorate %indata1 Binding 0\n"
			"OpDecorate %indata2 DescriptorSet 0\n"
			"OpDecorate %indata2 Binding 1\n"
			"OpDecorate %outdata DescriptorSet 0\n"
			"OpDecorate %outdata Binding 2\n"
			"OpDecorate %i32arr ArrayStride 4\n"
			"OpMemberDecorate %buf 0 Offset 0\n"

			+ string(getComputeAsmCommonTypes()) +

			"%buf        = OpTypeStruct %i32arr\n"
			"%bufptr     = OpTypePointer Uniform %buf\n"
			"%indata1    = OpVariable %bufptr Uniform\n"
			"%indata2    = OpVariable %bufptr Uniform\n"
			"%outdata    = OpVariable %bufptr Uniform\n"

			"%id        = OpVariable %uvec3ptr Input\n"
			"%zero      = OpConstant %i32 0\n"

			"%main      = OpFunction %void None %voidf\n"
			"%label     = OpLabel\n"
			"%idval     = OpLoad %uvec3 %id\n"
			"%x         = OpCompositeExtract %u32 %idval 0\n"
			"%inloc1    = OpAccessChain %i32ptr %indata1 %zero %x\n"
			"%inval1    = OpLoad %i32 %inloc1\n"
			"%inloc2    = OpAccessChain %i32ptr %indata2 %zero %x\n"
			"%inval2    = OpLoad %i32 %inloc2\n"
			"%rem       = OpSRem %i32 %inval1 %inval2\n"
			"%outloc    = OpAccessChain %i32ptr %outdata %zero %x\n"
			"             OpStore %outloc %rem\n"
			"             OpReturn\n"
			"             OpFunctionEnd\n";

		spec.inputs.push_back	(BufferSp(new Int32Buffer(inputInts1)));
		spec.inputs.push_back	(BufferSp(new Int32Buffer(inputInts2)));
		spec.outputs.push_back	(BufferSp(new Int32Buffer(outputInts)));
		spec.numWorkGroups		= IVec3(numElements, 1, 1);
		spec.failResult			= params.failResult;
		spec.failMessage		= params.failMessage;

		group->addChild(new SpvAsmComputeShaderCase(testCtx, params.name, "", spec));
	}

	return group.release();
}